

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arduino-rx-web.cpp
# Opt level: O2

bool GGWave_mainLoop(void)

{
  bool bVar1;
  FILE *__stream;
  char cVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined8 uVar8;
  time_point tVar9;
  tm *__tp;
  char *pcVar10;
  allocator local_61;
  time_t timestamp;
  TxRxData rxData;
  string tstr;
  
  bVar1 = (anonymous_namespace)::g_devIdOut != 0 || (anonymous_namespace)::g_devIdInp != 0;
  tVar9.__d.__r = GGWave_mainLoop::tLastNoData.__d.__r;
  if ((anonymous_namespace)::g_devIdOut != 0 || (anonymous_namespace)::g_devIdInp != 0) {
    cVar2 = GGWave::txHasData();
    if (cVar2 == '\0') {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,0);
      if ((GGWave_mainLoop()::tLastNoData == '\0') &&
         (iVar4 = __cxa_guard_acquire(&GGWave_mainLoop()::tLastNoData), iVar4 != 0)) {
        GGWave_mainLoop::tLastNoData.__d.__r = (duration)std::chrono::_V2::system_clock::now();
        __cxa_guard_release(&GGWave_mainLoop()::tLastNoData);
      }
      tVar9.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      iVar4 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdOut);
      iVar5 = GGWave::samplesPerFrame();
      iVar6 = GGWave::sampleSizeOut();
      if (iVar4 < iVar6 * iVar5) {
        SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,0);
        iVar4 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
        iVar5 = GGWave::samplesPerFrame();
        iVar6 = GGWave::sampleSizeInp();
        if ((500.0 < (float)(((long)tVar9.__d.__r - (long)GGWave_mainLoop::tLastNoData.__d.__r) /
                            1000) / 1000.0) && (iVar6 = iVar6 * iVar5, iVar6 <= iVar4)) {
          if ((GGWave_mainLoop()::dataInp == '\0') &&
             (iVar5 = __cxa_guard_acquire(&GGWave_mainLoop()::dataInp), iVar5 != 0)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&GGWave_mainLoop::dataInp,(long)iVar6,(allocator_type *)&tstr);
            __cxa_atexit(std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector,
                         &GGWave_mainLoop::dataInp,&__dso_handle);
            __cxa_guard_release(&GGWave_mainLoop()::dataInp);
          }
          SDL_DequeueAudio((anonymous_namespace)::g_devIdInp,
                           GGWave_mainLoop::dataInp.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,iVar6);
          cVar2 = GGWave::decode((anonymous_namespace)::g_ggWave,
                                 (uint)GGWave_mainLoop::dataInp.
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start);
          if (cVar2 == '\0') {
            fwrite("Warning: failed to decode input data!\n",0x26,1,_stderr);
          }
          else {
            rxData.m_data = (uchar *)0x0;
            rxData.m_size = 0;
            iVar5 = GGWave::rxTakeData((anonymous_namespace)::g_ggWave);
            if (0 < iVar5) {
              timestamp = time((time_t *)0x0);
              __tp = localtime(&timestamp);
              pcVar10 = asctime(__tp);
              std::__cxx11::string::string((string *)&tstr,pcVar10,&local_61);
              tstr._M_dataplus._M_p[tstr._M_string_length - 1] = '\0';
              printf("[%s] Received: \'%s\'\n",tstr._M_dataplus._M_p,rxData.m_data);
              std::__cxx11::string::~string((string *)&tstr);
            }
          }
          __stream = _stderr;
          if (iVar4 <= iVar6 * 0x20) {
            return bVar1;
          }
          uVar7 = SDL_GetQueuedAudioSize((anonymous_namespace)::g_devIdInp);
          fprintf(__stream,"Warning: slow processing, clearing queued audio buffer of %d bytes ...",
                  (ulong)uVar7);
        }
        SDL_ClearQueuedAudio((anonymous_namespace)::g_devIdInp);
        tVar9 = GGWave_mainLoop::tLastNoData;
      }
    }
    else {
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdOut,1);
      SDL_PauseAudioDevice((anonymous_namespace)::g_devIdInp,1);
      uVar3 = GGWave::encode();
      iVar4 = (anonymous_namespace)::g_devIdOut;
      uVar8 = GGWave::txWaveform();
      SDL_QueueAudio(iVar4,uVar8,uVar3);
      tVar9 = GGWave_mainLoop::tLastNoData;
    }
  }
  GGWave_mainLoop::tLastNoData.__d.__r = tVar9.__d.__r;
  return bVar1;
}

Assistant:

bool GGWave_mainLoop() {
    if (g_devIdInp == 0 && g_devIdOut == 0) {
        return false;
    }

    if (g_ggWave->txHasData() == false) {
        SDL_PauseAudioDevice(g_devIdOut, SDL_FALSE);

        static auto tLastNoData = std::chrono::high_resolution_clock::now();
        auto tNow = std::chrono::high_resolution_clock::now();

        if ((int) SDL_GetQueuedAudioSize(g_devIdOut) < g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeOut()) {
            SDL_PauseAudioDevice(g_devIdInp, SDL_FALSE);
            const int nHave = (int) SDL_GetQueuedAudioSize(g_devIdInp);
            const int nNeed = g_ggWave->samplesPerFrame()*g_ggWave->sampleSizeInp();
            if (::getTime_ms(tLastNoData, tNow) > 500.0f && nHave >= nNeed) {
                static std::vector<uint8_t> dataInp(nNeed);
                SDL_DequeueAudio(g_devIdInp, dataInp.data(), nNeed);

                if (g_ggWave->decode(dataInp.data(), dataInp.size()) == false) {
                    fprintf(stderr, "Warning: failed to decode input data!\n");
                } else {
                    GGWave::TxRxData rxData;
                    int n = g_ggWave->rxTakeData(rxData);
                    if (n > 0) {
                        std::time_t timestamp = std::time(nullptr);
                        std::string tstr = std::asctime(std::localtime(&timestamp));
                        tstr.back() = 0;
                        printf("[%s] Received: '%s'\n", tstr.c_str(), rxData.data());
                    }
                }

                if (nHave > 32*nNeed) {
                    fprintf(stderr, "Warning: slow processing, clearing queued audio buffer of %d bytes ...", SDL_GetQueuedAudioSize(g_devIdInp));
                    SDL_ClearQueuedAudio(g_devIdInp);
                }
            } else {
                SDL_ClearQueuedAudio(g_devIdInp);
            }
        } else {
            tLastNoData = tNow;
        }
    } else {
        SDL_PauseAudioDevice(g_devIdOut, SDL_TRUE);
        SDL_PauseAudioDevice(g_devIdInp, SDL_TRUE);

        const auto nBytes = g_ggWave->encode();
        SDL_QueueAudio(g_devIdOut, g_ggWave->txWaveform(), nBytes);
    }

    return true;
}